

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

SharedPtr<deqp::egl::GLES2ThreadTest::Program> __thiscall
deqp::egl::GLES2ThreadTest::GLES2ResourceManager::popProgram(GLES2ResourceManager *this,int index)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> SVar2;
  
  lVar1 = CONCAT44(in_register_00000034,index);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)this,
             (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)
             (*(long *)(lVar1 + 0x48) + (long)in_EDX * 0x10));
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
  ::erase((vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>_>_>
           *)(lVar1 + 0x48),
          (SharedPtr<deqp::egl::GLES2ThreadTest::Program> *)
          ((long)in_EDX * 0x10 + *(long *)(lVar1 + 0x48)));
  SVar2.m_state = extraout_RDX;
  SVar2.m_ptr = (Program *)this;
  return SVar2;
}

Assistant:

SharedPtr<Program> GLES2ResourceManager::popProgram (int index)
{
	SharedPtr<Program> program = m_programs[index];

	m_programs.erase(m_programs.begin() + index);

	return program;
}